

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QStandardItemData>>
          (QDataStream *s,QList<QStandardItemData> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  qint64 extendedLen;
  uint local_6c;
  QStandardItemData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QStandardItemData>::clear(c);
  local_6c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_6c);
  asize = (undefined1 *)(ulong)local_6c;
  if (asize == (undefined1 *)0xffffffff) {
    asize = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_6c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_68);
    asize = (undefined1 *)local_68._0_8_;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QStandardItemData>::reserve(c,(qsizetype)asize);
    if (asize != (undefined1 *)0x0) {
      do {
        asize = asize + -1;
        local_68._0_8_ = (undefined1 *)0xaaaaaaaaffffffff;
        local_68.value.d.data.shared = (PrivateShared *)0x0;
        local_68.value.d.data._8_8_ = 0;
        local_68.value.d.data._16_8_ = 0;
        local_68.value.d._24_8_ = 2;
        QDataStream::operator>>(s,&local_68.role);
        ::operator>>(s,&local_68.value);
        QVar2 = s[0x13];
        if (QVar2 == (QDataStream)0x0) {
          QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData_const&>
                    ((QMovableArrayOps<QStandardItemData> *)c,(c->d).size,&local_68);
          QList<QStandardItemData>::end(c);
        }
        else {
          QList<QStandardItemData>::clear(c);
        }
        ::QVariant::~QVariant((QVariant *)&local_68.value);
      } while ((QVar2 == (QDataStream)0x0) && (asize != (undefined1 *)0x0));
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}